

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O1

DdNode * Cudd_Disequality(DdManager *dd,int N,int c,DdNode **x,DdNode **y)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  long lVar12;
  int iVar13;
  DdNode *n;
  int iVar14;
  bool bVar15;
  int iVar16;
  DdNode *n_00;
  DdNode *pDVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  DdNode *pDVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  bool bVar27;
  bool bVar28;
  int local_148;
  int local_144;
  DdNode *local_138;
  DdNode *local_130;
  int local_10c;
  DdNode *local_c8;
  
  pDVar22 = dd->one;
  pDVar9 = (DdNode *)((ulong)pDVar22 ^ 1);
  iVar18 = 1 << ((byte)N - 1 & 0x1f);
  if (N < 0) {
LAB_00789875:
    pDVar22 = (DdNode *)0x0;
  }
  else if (N == 0) {
    if (c == 0) {
      pDVar22 = pDVar9;
    }
  }
  else {
    iVar5 = 1 << ((byte)N & 0x1f);
    uVar26 = 1;
    if (1 - iVar5 <= c && c < iVar5) {
      uVar19 = 1;
      local_c8 = (DdNode *)0x0;
      local_138 = (DdNode *)0x0;
      local_130 = (DdNode *)0x0;
      iVar5 = c + 1;
      local_148 = iVar18;
      local_144 = iVar18;
      local_10c = c + -1;
      do {
        iVar24 = c + -1 >> ((byte)uVar19 & 0x1f);
        iVar1 = iVar24 + 2;
        iVar20 = c + 1 >> ((byte)uVar19 & 0x1f);
        bVar27 = (uVar26 & c + 2U) != 1;
        iVar14 = iVar20 + (uint)bVar27;
        bVar15 = iVar14 <= iVar1;
        iVar23 = iVar18;
        iVar21 = iVar18;
        if (iVar1 < iVar14) {
          pDVar11 = (DdNode *)0x0;
          pDVar17 = (DdNode *)0x0;
        }
        else {
          lVar12 = (uint)N - uVar19;
          iVar6 = 1 << ((byte)lVar12 & 0x1f);
          uVar4 = (uint)bVar27;
          iVar25 = iVar20 * 2;
          iVar13 = local_144 + uVar4 * -2;
          iVar16 = c + uVar4 * -2;
          iVar7 = local_148 + uVar4 * -2;
          n_00 = (DdNode *)0x0;
          n = (DdNode *)0x0;
          do {
            iVar2 = iVar14 + -1;
            pDVar11 = n;
            iVar8 = iVar21;
            if ((iVar2 < iVar6) && (-iVar6 < iVar2)) {
              iVar8 = uVar4 * 2 + iVar25 + -2;
              pDVar11 = pDVar22;
              if (((iVar8 <= iVar5) && (local_10c < (int)((uint)bVar27 * 2 + -3 + iVar25))) &&
                 ((uVar19 != 1 || (pDVar11 = pDVar9, iVar16 + 3 != iVar25)))) {
                if ((iVar7 + 3 != iVar25) && (iVar13 + 3 != iVar25)) {
                  __assert_fail("leftChild == index[0] || leftChild == index[1]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                ,0x3ed,
                                "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                pDVar11 = local_130;
                if (iVar7 + 3 == iVar25) {
                  pDVar11 = local_138;
                }
              }
              pDVar17 = pDVar22;
              if (((iVar8 < iVar5) && (local_10c < iVar8)) &&
                 ((uVar19 != 1 || (pDVar17 = pDVar9, iVar16 + 2 != iVar25)))) {
                if ((iVar7 + 2 != iVar25) && (iVar13 + 2 != iVar25)) {
                  __assert_fail("middleChild == index[0] || middleChild == index[1]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                ,0x3fc,
                                "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                pDVar17 = local_130;
                if (iVar7 + 2 == iVar25) {
                  pDVar17 = local_138;
                }
              }
              pDVar10 = pDVar22;
              if ((((int)((bVar27 - 1) + (uint)bVar27 + iVar25) < iVar5) && (local_10c <= iVar8)) &&
                 ((uVar19 != 1 || (pDVar10 = pDVar9, iVar16 + 1 != iVar25)))) {
                if ((iVar7 + 1 != iVar25) && (iVar13 + 1 != iVar25)) {
                  __assert_fail("rightChild == index[0] || rightChild == index[1]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                ,0x40b,
                                "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                pDVar10 = local_130;
                if (iVar7 + 1 == iVar25) {
                  pDVar10 = local_138;
                }
              }
              pDVar10 = Cudd_bddIte(dd,y[lVar12],pDVar17,pDVar10);
              if (pDVar10 == (DdNode *)0x0) {
LAB_00789756:
                if (local_148 != iVar18) {
                  Cudd_IterDerefBdd(dd,local_138);
                }
                if (local_144 != iVar18) {
                  Cudd_IterDerefBdd(dd,local_130);
                }
                if (iVar21 != iVar18) {
                  Cudd_IterDerefBdd(dd,n);
                }
              }
              else {
                piVar3 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
                *piVar3 = *piVar3 + 1;
                pDVar11 = Cudd_bddIte(dd,y[lVar12],pDVar11,pDVar17);
                if (pDVar11 == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(dd,pDVar10);
                  goto LAB_00789756;
                }
                piVar3 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
                *piVar3 = *piVar3 + 1;
                local_c8 = Cudd_bddIte(dd,x[lVar12],pDVar10,pDVar11);
                if (local_c8 != (DdNode *)0x0) {
                  piVar3 = (int *)(((ulong)local_c8 & 0xfffffffffffffffe) + 4);
                  *piVar3 = *piVar3 + 1;
                  Cudd_IterDerefBdd(dd,pDVar10);
                  Cudd_IterDerefBdd(dd,pDVar11);
                  if (iVar23 != iVar18 && iVar21 != iVar18) {
                    __assert_fail("newIndex[0] == invalidIndex || newIndex[1] == invalidIndex",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                  ,0x436,
                                  "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                                 );
                  }
                  pDVar11 = local_c8;
                  iVar8 = iVar2;
                  if (iVar21 != iVar18) {
                    pDVar11 = n;
                    n_00 = local_c8;
                    iVar8 = iVar21;
                    iVar23 = iVar2;
                  }
                  goto LAB_0078966c;
                }
                Cudd_IterDerefBdd(dd,pDVar10);
                Cudd_IterDerefBdd(dd,pDVar11);
                if (local_148 != iVar18) {
                  Cudd_IterDerefBdd(dd,local_138);
                }
                if (local_144 != iVar18) {
                  Cudd_IterDerefBdd(dd,local_130);
                }
                if (iVar21 != iVar18) {
                  Cudd_IterDerefBdd(dd,n);
                }
                local_c8 = (DdNode *)0x0;
              }
              if (iVar23 == iVar18) goto LAB_0078970b;
              goto LAB_007896f3;
            }
LAB_0078966c:
            iVar21 = iVar8;
            bVar15 = iVar14 < iVar1;
            iVar14 = iVar14 + 1;
            iVar25 = iVar25 + 2;
            n = pDVar11;
            pDVar17 = n_00;
          } while (iVar24 + 3 != iVar14);
        }
        if (local_148 != iVar18) {
          Cudd_IterDerefBdd(dd,local_138);
        }
        bVar28 = local_144 != iVar18;
        n_00 = local_130;
        local_148 = iVar21;
        local_144 = iVar23;
        local_138 = pDVar11;
        local_130 = pDVar17;
        if (bVar28) {
LAB_007896f3:
          Cudd_IterDerefBdd(dd,n_00);
        }
LAB_0078970b:
        if (bVar15) goto LAB_00789875;
        local_10c = iVar20 + (uint)bVar27 + -2;
        uVar26 = uVar26 * 2 + 1;
        uVar19 = uVar19 + 1;
        iVar5 = iVar1;
      } while (uVar19 != N + 1);
      piVar3 = (int *)(((ulong)local_c8 & 0xfffffffffffffffe) + 4);
      *piVar3 = *piVar3 + -1;
      pDVar22 = local_c8;
    }
  }
  return pDVar22;
}

Assistant:

DdNode *
Cudd_Disequality(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  int c /* right-hand side constant */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    /* The nodes at level i represent values of the difference that are
    ** multiples of 2^i.  We use variables with names starting with k
    ** to denote the multipliers of 2^i in such multiples. */
    int kTrueLb = c + 1;
    int kTrueUb = c - 1;
    int kFalse = c;
    /* Mask used to compute the ceiling function.  Since we divide by 2^i,
    ** we want to know whether the dividend is a multiple of 2^i.  If it is,
    ** then ceiling and floor coincide; otherwise, they differ by one. */
    int mask = 1;
    int i;

    DdNode *f = NULL;           /* the eventual result */
    DdNode *one = DD_ONE(dd);
    DdNode *zero = Cudd_Not(one);

    /* Two x-labeled nodes are created at most at each iteration.  They are
    ** stored, along with their k values, in these variables.  At each level,
    ** the old nodes are freed and the new nodes are copied into the old map.
    */
    DdNode *map[2] = {0};
    int invalidIndex = 1 << (N-1);
    int index[2] = {invalidIndex, invalidIndex};

    /* This should never happen. */
    if (N < 0) return(NULL);

    /* If there are no bits, both operands are 0.  The result depends on c. */
    if (N == 0) {
        if (c != 0) return(one);
        else return(zero);
    }

    /* The maximum or the minimum difference comparing to c can generate the terminal case */
    if ((1 << N) - 1 < c || (-(1 << N) + 1) > c) return(one);

    /* Build the result bottom up. */
    for (i = 1; i <= N; i++) {
        int kTrueLbLower, kTrueUbLower;
        int leftChild, middleChild, rightChild;
        DdNode *g0, *g1, *fplus, *fequal, *fminus;
        int j;
        DdNode *newMap[2] = {NULL};
        int newIndex[2];

        kTrueLbLower = kTrueLb;
        kTrueUbLower = kTrueUb;
        /* kTrueLb = floor((c-1)/2^i) + 2 */
        kTrueLb = ((c-1) >> i) + 2;
        /* kTrueUb = ceiling((c+1)/2^i) - 2 */
        kTrueUb = ((c+1) >> i) + (((c+2) & mask) != 1) - 2;
        mask = (mask << 1) | 1;
        newIndex[0] = invalidIndex;
        newIndex[1] = invalidIndex;

        for (j = kTrueUb + 1; j < kTrueLb; j++) {
            /* Skip if node is not reachable from top of BDD. */
            if ((j >= (1 << (N - i))) || (j <= -(1 << (N -i)))) continue;

            /* Find f- */
            leftChild = (j << 1) - 1;
            if (leftChild >= kTrueLbLower || leftChild <= kTrueUbLower) {
                fminus = one;
            } else if (i == 1 && leftChild == kFalse) {
                fminus = zero;
            } else {
                assert(leftChild == index[0] || leftChild == index[1]);
                if (leftChild == index[0]) {
                    fminus = map[0];
                } else {
                    fminus = map[1];
                }
            }

            /* Find f= */
            middleChild = j << 1;
            if (middleChild >= kTrueLbLower || middleChild <= kTrueUbLower) {
                fequal = one;
            } else if (i == 1 && middleChild == kFalse) {
                fequal = zero;
            } else {
                assert(middleChild == index[0] || middleChild == index[1]);
                if (middleChild == index[0]) {
                    fequal = map[0];
                } else {
                    fequal = map[1];
                }
            }

            /* Find f+ */
            rightChild = (j << 1) + 1;
            if (rightChild >= kTrueLbLower || rightChild <= kTrueUbLower) {
                fplus = one;
            } else if (i == 1 && rightChild == kFalse) {
                fplus = zero;
            } else {
                assert(rightChild == index[0] || rightChild == index[1]);
                if (rightChild == index[0]) {
                    fplus = map[0];
                } else {
                    fplus = map[1];
                }
            }

            /* Build new nodes. */
            g1 = Cudd_bddIte(dd, y[N - i], fequal, fplus);
            if (g1 == NULL) {
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g1);
            g0 = Cudd_bddIte(dd, y[N - i], fminus, fequal);
            if (g0 == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g0);
            f = Cudd_bddIte(dd, x[N - i], g1, g0);
            if (f == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                Cudd_IterDerefBdd(dd, g0);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(f);
            Cudd_IterDerefBdd(dd, g1);
            Cudd_IterDerefBdd(dd, g0);

            /* Save newly computed node in map. */
            assert(newIndex[0] == invalidIndex || newIndex[1] == invalidIndex);
            if (newIndex[0] == invalidIndex) {
                newIndex[0] = j;
                newMap[0] = f;
            } else {
                newIndex[1] = j;
                newMap[1] = f;
            }
        }

        /* Copy new map to map. */
        if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
        if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
        map[0] = newMap[0];
        map[1] = newMap[1];
        index[0] = newIndex[0];
        index[1] = newIndex[1];
    }

    cuddDeref(f);
    return(f);

}